

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_arm64.c
# Opt level: O1

int main(void)

{
  uint reg;
  x86_op_type xVar1;
  cs_detail *pcVar2;
  anon_union_1480_8_3a70395c_for_cs_detail_6 *paVar3;
  size_t count;
  cs_err cVar4;
  size_t len;
  ulong uVar5;
  size_t len_00;
  ulong uVar6;
  size_t sVar7;
  char *__format;
  char *pcVar8;
  cs_insn *insn;
  cs_insn *local_40;
  size_t local_38;
  
  cVar4 = cs_open(CS_ARCH_ARM64,CS_MODE_ARM,&handle);
  if (cVar4 == CS_ERR_OK) {
    cs_option(handle,CS_OPT_DETAIL,3);
    local_38 = cs_disasm(handle,(uint8_t *)"\t",0x44,0x2c,0,&local_40);
    if (local_38 == 0) {
      puts("****************");
      printf("Platform: %s\n","ARM-64");
      print_string_hex("\t",(uchar *)0x44,len_00);
      puts("ERROR: Failed to disasm given code!");
    }
    else {
      puts("****************");
      printf("Platform: %s\n","ARM-64");
      print_string_hex("\t",(uchar *)0x44,len);
      puts("Disasm:");
      sVar7 = 0;
      do {
        printf("0x%lx:\t%s\t%s\n",local_40[sVar7].address,local_40[sVar7].mnemonic,
               local_40[sVar7].op_str);
        pcVar2 = local_40[sVar7].detail;
        if (pcVar2 != (cs_detail *)0x0) {
          if ((pcVar2->field_6).x86.opcode[2] != '\0') {
            printf("\top_count: %u\n");
          }
          if ((pcVar2->field_6).x86.opcode[2] != '\0') {
            uVar6 = 0;
            paVar3 = &pcVar2->field_6;
            do {
              switch((paVar3->x86).avx_cc) {
              case 0x40:
                uVar5 = (ulong)(paVar3->x86).avx_rm;
                pcVar8 = "\t\toperands[%u].type: C-IMM = %u\n";
                break;
              case 0x41:
                uVar5 = (ulong)(paVar3->x86).avx_rm;
                pcVar8 = "\t\toperands[%u].type: REG_MRS = 0x%x\n";
                break;
              case 0x42:
                uVar5 = (ulong)(paVar3->x86).avx_rm;
                pcVar8 = "\t\toperands[%u].type: REG_MSR = 0x%x\n";
                break;
              case 0x43:
                uVar5 = (ulong)(paVar3->x86).avx_rm;
                pcVar8 = "\t\toperands[%u].type: PSTATE = 0x%x\n";
                break;
              case 0x44:
                uVar5 = (ulong)(paVar3->x86).avx_rm;
                pcVar8 = "\t\toperands[%u].type: SYS = 0x%x\n";
                break;
              case 0x45:
                uVar5 = (ulong)(paVar3->x86).avx_rm;
                pcVar8 = "\t\toperands[%u].type: PREFETCH = 0x%x\n";
                break;
              case 0x46:
                uVar5 = (ulong)(paVar3->x86).avx_rm;
                pcVar8 = "\t\toperands[%u].type: BARRIER = 0x%x\n";
                break;
              default:
                switch((paVar3->x86).avx_cc) {
                case X86_AVX_CC_EQ:
                  pcVar8 = cs_reg_name(handle,(paVar3->x86).avx_rm);
                  __format = "\t\toperands[%u].type: REG = %s\n";
                  goto LAB_001434ad;
                case X86_AVX_CC_LT:
                  pcVar8 = *(char **)((long)paVar3 + 0x28);
                  __format = "\t\toperands[%u].type: IMM = 0x%lx\n";
LAB_001434ad:
                  printf(__format,uVar6 & 0xffffffff,pcVar8);
                  break;
                case X86_AVX_CC_LE:
                  printf("\t\toperands[%u].type: MEM\n",uVar6 & 0xffffffff);
                  if ((paVar3->x86).avx_rm != X86_AVX_RM_INVALID) {
                    pcVar8 = cs_reg_name(handle,(paVar3->x86).avx_rm);
                    printf("\t\t\toperands[%u].mem.base: REG = %s\n",uVar6 & 0xffffffff,pcVar8);
                  }
                  reg = *(uint *)((long)&(paVar3->mips).operands[1].field_1 + 4);
                  if (reg != 0) {
                    pcVar8 = cs_reg_name(handle,reg);
                    printf("\t\t\toperands[%u].mem.index: REG = %s\n",uVar6 & 0xffffffff,pcVar8);
                  }
                  xVar1 = (paVar3->x86).operands[0].type;
                  uVar5 = (ulong)xVar1;
                  if (xVar1 != X86_OP_INVALID) {
                    pcVar8 = "\t\t\toperands[%u].mem.disp: 0x%x\n";
                    goto LAB_001434d0;
                  }
                  break;
                case X86_AVX_CC_UNORD:
                  printf("\t\toperands[%u].type: FP = %f\n",*(undefined8 *)((long)paVar3 + 0x28),
                         uVar6 & 0xffffffff);
                }
                goto switchD_001433b3_default;
              }
LAB_001434d0:
              printf(pcVar8,uVar6 & 0xffffffff,uVar5);
switchD_001433b3_default:
              if (((paVar3->arm64).operands[0].shift.type != ARM64_SFT_INVALID) &&
                 ((paVar3->x86).sib_base != X86_REG_INVALID)) {
                printf("\t\t\tShift: type = %u, value = %u\n");
              }
              if ((paVar3->x86).sse_cc != X86_SSE_CC_INVALID) {
                printf("\t\t\tExt: %u\n");
              }
              if ((paVar3->x86).disp != 0) {
                printf("\t\t\tVector Arrangement Specifier: 0x%x\n");
              }
              if ((paVar3->x86).sib_index != X86_REG_INVALID) {
                printf("\t\t\tVector Element Size Specifier: %u\n");
              }
              if ((paVar3->arm64).operands[0].vector_index != -1) {
                printf("\t\t\tVector Index: %u\n");
              }
              uVar6 = uVar6 + 1;
              paVar3 = (anon_union_1480_8_3a70395c_for_cs_detail_6 *)(paVar3->x86).operands;
            } while (uVar6 < (pcVar2->field_6).x86.opcode[2]);
          }
          if ((pcVar2->field_6).x86.opcode[0] == '\x01') {
            puts("\tUpdate-flags: True");
          }
          if ((pcVar2->field_6).x86.opcode[1] == '\x01') {
            puts("\tWrite-back: True");
          }
          if ((pcVar2->field_6).arm64.cc != ARM64_CC_INVALID) {
            printf("\tCode-condition: %u\n");
          }
          putchar(10);
        }
        count = local_38;
        sVar7 = sVar7 + 1;
      } while (sVar7 != local_38);
      printf("0x%lx:\n",(ulong)local_40[local_38 - 1].size + local_40[local_38 - 1].address);
      cs_free(local_40,count);
    }
    putchar(10);
    cs_close(&handle);
  }
  else {
    printf("Failed on cs_open() with error returned: %u\n",(ulong)cVar4);
  }
  return 0;
}

Assistant:

static void test()
{
//#define ARM64_CODE "\xe1\x0b\x40\xb9"	// ldr		w1, [sp, #0x8]
//#define ARM64_CODE "\x21\x7c\x00\x53"	// lsr	w1, w1, #0x0
//#define ARM64_CODE "\x21\x7c\x02\x9b"
//#define ARM64_CODE "\x20\x04\x81\xda"	// csneg	x0, x1, x1, eq | cneg x0, x1, ne
//#define ARM64_CODE "\x20\x08\x02\x8b"		// add	x0, x1, x2, lsl #2

//#define ARM64_CODE "\x20\xcc\x20\x8b"
//#define ARM64_CODE "\xe2\x8f\x40\xa9"	// ldp	x2, x3, [sp, #8]
//#define ARM64_CODE "\x20\x40\x60\x1e"	// fmov d0, d1
//#define ARM64_CODE "\x20\x7c\x7d\x93"	// sbfiz	x0, x1, #3, #32

//#define ARM64_CODE "\x20\x88\x43\xb3"	// bfxil	x0, x1, #3, #32
//#define ARM64_CODE "\x01\x71\x08\xd5"	// sys	#0, c7, c1, #0, x1
//#define ARM64_CODE "\x00\x71\x28\xd5"	// sysl	x0, #0, c7, c1, #0

//#define ARM64_CODE "\x20\xf4\x18\x9e"	// fcvtzs	x0, s1, #3
//#define ARM64_CODE "\x20\x74\x0b\xd5"	// dc	zva, x0: FIXME: handle as "sys" insn
//#define ARM64_CODE "\x00\x90\x24\x1e"	// fmov s0, ##10.00000000
//#define ARM64_CODE "\xe1\x0b\x40\xb9"	// ldr		w1, [sp, #0x8]
//#define ARM64_CODE "\x20\x78\x62\xf8"	// ldr x0, [x1, x2, lsl #3]
//#define ARM64_CODE "\x41\x14\x44\xb3"	// bfm	x1, x2, #4, #5
//#define ARM64_CODE "\x80\x23\x29\xd5"	// sysl	x0, #1, c2, c3, #4
//#define ARM64_CODE "\x20\x00\x24\x1e"	// fcvtas	w0, s1
//#define ARM64_CODE "\x41\x04\x40\xd2"	// eor	x1, x2, #0x3
//#define ARM64_CODE "\x9f\x33\x03\xd5"	// 	dsb	osh
//#define ARM64_CODE "\x41\x10\x23\x8a"	// bic	x1, x2, x3, lsl #4
//#define ARM64_CODE "\x16\x41\x3c\xd5"	// mrs	x22, sp_el1
//#define ARM64_CODE "\x41\x1c\x63\x0e"	// bic	v1.8b, v2.8b, v3.8b
//#define ARM64_CODE "\x41\xd4\xe3\x6e"	// fabd	v1.2d, v2.2d, v3.2d
//#define ARM64_CODE "\x20\x8c\x62\x2e"	// cmeq	v0.4h, v1.4h, v2.4h
//#define ARM64_CODE "\x20\x98\x20\x4e"	// cmeq	v0.16b, v1.16b, #0
//#define ARM64_CODE "\x20\x2c\x05\x4e"	// smov	x0, v1.b[2]
//#define ARM64_CODE "\x21\xe4\x00\x2f"	// movi d1, #0xff
//#define ARM64_CODE "\x60\x78\x08\xd5"	// at	s1e0w, x0	// FIXME: same problem with dc ZVA
//#define ARM64_CODE "\x20\x00\xa0\xf2"	// movk	x0, #1, lsl #16
//#define ARM64_CODE "\x20\x08\x00\xb1"	// adds	x0, x1, #0x2
//#define ARM64_CODE "\x41\x04\x00\x0f"	// movi v1.2s, #0x2
//#define ARM64_CODE "\x06\x00\x00\x14"	// b 0x44
//#define ARM64_CODE "\x00\x90\x24\x1e"	// fmov s0, ##10.00000000
//#define ARM64_CODE "\x5f\x3f\x03\xd5"	// clrex
//#define ARM64_CODE "\x5f\x3e\x03\xd5"	// clrex #14
//#define ARM64_CODE "\x20\x00\x02\xab"	// adds	 x0, x1, x2 (alias of adds x0, x1, x2, lsl #0)
//#define ARM64_CODE "\x20\xf4\x18\x9e"	// fcvtzs	x0, s1, #3
//#define ARM64_CODE "\x20\xfc\x02\x9b"	// mneg	x0, x1, x2
//#define ARM64_CODE "\xd0\xb6\x1e\xd5"	// msr	s3_6_c11_c6_6, x16

//#define ARM64_CODE "\x21\x7c\x02\x9b\x21\x7c\x00\x53\x00\x40\x21\x4b\xe1\x0b\x40\xb9\x20\x04\x81\xda\x20\x08\x02\x8b"

//#define ARM64_CODE "\x09\x00\x38\xd5"	// DBarrier
//#define ARM64_CODE "\x20\xe4\x3d\x0f\xa2\x00\xae\x9e"
//#define ARM64_CODE "\x9f\x37\x03\xd5\xbf\x33\x03\xd5\xdf\x3f\x03\xd5"	// DBarrier
//#define ARM64_CODE "\x10\x5b\xe8\x3c"
//#define ARM64_CODE "\x00\x18\xa0\x5f\xa2\x00\xae\x9e"

#define ARM64_CODE "\x09\x00\x38\xd5\xbf\x40\x00\xd5\x0c\x05\x13\xd5\x20\x50\x02\x0e\x20\xe4\x3d\x0f\x00\x18\xa0\x5f\xa2\x00\xae\x9e\x9f\x37\x03\xd5\xbf\x33\x03\xd5\xdf\x3f\x03\xd5\x21\x7c\x02\x9b\x21\x7c\x00\x53\x00\x40\x21\x4b\xe1\x0b\x40\xb9\x20\x04\x81\xda\x20\x08\x02\x8b\x10\x5b\xe8\x3c"

	struct platform platforms[] = {
		{
			CS_ARCH_ARM64,
			CS_MODE_ARM,
			(unsigned char *)ARM64_CODE,
			sizeof(ARM64_CODE) - 1,
			"ARM-64"
		},
	};

	uint64_t address = 0x2c;
	cs_insn *insn;
	int i;
	size_t count;

	for (i = 0; i < sizeof(platforms)/sizeof(platforms[0]); i++) {
		cs_err err = cs_open(platforms[i].arch, platforms[i].mode, &handle);
		if (err) {
			printf("Failed on cs_open() with error returned: %u\n", err);
			continue;
		}

		cs_option(handle, CS_OPT_DETAIL, CS_OPT_ON);

		count = cs_disasm(handle, platforms[i].code, platforms[i].size, address, 0, &insn);
		if (count) {
			size_t j;

			printf("****************\n");
			printf("Platform: %s\n", platforms[i].comment);
			print_string_hex("Code: ", platforms[i].code, platforms[i].size);
			printf("Disasm:\n");

			for (j = 0; j < count; j++) {
				printf("0x%"PRIx64":\t%s\t%s\n", insn[j].address, insn[j].mnemonic, insn[j].op_str);
				print_insn_detail(&insn[j]);
			}
			printf("0x%"PRIx64":\n", insn[j-1].address + insn[j-1].size);

			// free memory allocated by cs_disasm()
			cs_free(insn, count);
		} else {
			printf("****************\n");
			printf("Platform: %s\n", platforms[i].comment);
			print_string_hex("Code: ", platforms[i].code, platforms[i].size);
			printf("ERROR: Failed to disasm given code!\n");
		}

		printf("\n");

		cs_close(&handle);
	}
}